

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExceptions_cpp.h
# Opt level: O2

void __thiscall moira::Moira::execException<(moira::Core)1>(Moira *this,M68kException exc,int nr)

{
  M68kException MVar1;
  u16 sr;
  ushort nr_00;
  u32 pc;
  uint uVar2;
  
  sr = getSR(this);
  MVar1 = ILLEGAL;
  if (exc != BKPT) {
    MVar1 = exc;
  }
  nr_00 = (ushort)MVar1;
  if (exc == TRAP) {
    nr_00 = (short)nr + 0x20;
  }
  (*this->_vptr_Moira[0xe])(this,(ulong)exc,(ulong)nr_00);
  this->exception = (uint)nr_00;
  setSupervisorMode(this,true);
  (this->reg).sr.t1 = false;
  (this->reg).sr.t0 = false;
  uVar2 = this->flags;
  this->flags = uVar2 & 0xffffffef;
  switch(exc) {
  case BUS_ERROR:
    writeStackFrame1011<(moira::Core)1>(this,sr,(this->reg).pc,(this->reg).pc0,2);
    uVar2 = 2;
    goto LAB_001b6abd;
  case ADDRESS_ERROR:
  case PRIVILEGE|ILLEGAL:
  case PRIVILEGE|DIVIDE_BY_ZERO:
    goto switchD_001b69c6_caseD_3;
  case ILLEGAL:
  case LINEA:
  case LINEF:
    this->flags = uVar2 & 0xffffffcf;
    pc = (this->reg).pc0;
    break;
  case DIVIDE_BY_ZERO:
  case CHK:
  case TRAPV:
    writeStackFrame0000<(moira::Core)1>(this,sr,(this->reg).pc,nr_00);
    jumpToVector<(moira::Core)1,10240ull>(this,(uint)nr_00);
    goto switchD_001b69c6_caseD_3;
  case PRIVILEGE:
    this->flags = uVar2 & 0xffffffcf;
    goto LAB_001b6a39;
  case TRACE:
    this->flags = uVar2 & 0xffffffcd;
LAB_001b6aa3:
    writeStackFrame0000<(moira::Core)1>(this,sr,(this->reg).pc,nr_00);
    uVar2 = (uint)nr_00;
LAB_001b6abd:
    jumpToVector<(moira::Core)1,0ull>(this,uVar2);
    goto switchD_001b69c6_caseD_3;
  case FORMAT_ERROR:
    this->flags = uVar2 & 0xffffffcf;
    pc = (this->reg).pc;
    break;
  default:
    if (exc == TRAP) goto LAB_001b6aa3;
    if (exc != BKPT) goto switchD_001b69c6_caseD_3;
    this->flags = uVar2 & 0xffffffcf;
    read<(moira::Core)1,(moira::AddrSpace)1,2,0ull>(this,(this->reg).pc);
LAB_001b6a39:
    pc = (this->reg).pc - 2;
  }
  writeStackFrame0000<(moira::Core)1>(this,sr,pc,nr_00);
  jumpToVector<(moira::Core)1,1024ull>(this,(uint)nr_00);
switchD_001b69c6_caseD_3:
  (*this->_vptr_Moira[0xf])(this,(ulong)exc,(ulong)nr_00);
  return;
}

Assistant:

void
Moira::execException(M68kException exc, int nr)
{
    u16 status = getSR();

    // Determine the exception vector number
    u16 vector = (exc == M68kException::TRAP) ? u16(exc) + u16(nr) : (exc == M68kException::BKPT) ? 4 : u16(exc);

    // Inform the delegate
    willExecute(exc, vector);

    // Remember the exception vector
    exception = vector;

    // Enter supervisor mode and leave trace mode
    setSupervisorMode(true);
    clearTraceFlags();

    switch (exc) {

        case M68kException::BUS_ERROR:

            // Write stack frame
            writeStackFrame1011<C>(status, reg.pc, reg.pc0, 2);

            // Branch to exception handler
            jumpToVector<C>(2);
            break;

        case M68kException::ILLEGAL:
        case M68kException::LINEA:
        case M68kException::LINEF:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            SYNC(4);

            // Write stack frame
            if (C == Core::C68010 || C == Core::C68020) {
                writeStackFrame0000<C>(status, reg.pc0, vector);
            } else {
                writeStackFrame0000<C>(status, reg.pc - 2, vector);
            }

            // Branch to exception handler
            jumpToVector<C, AE_SET_CB3>(vector);
            break;

        case M68kException::BKPT:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            SYNC(2);
            (void)readM<C, Mode::DN, Word>(reg.pc);
            SYNC(2);

            // Write stack frame
            writeStackFrame0000<C>(status, U32_SUB(reg.pc, 2), vector);

            // Branch to exception handler
            jumpToVector<C, AE_SET_CB3>(vector);
            break;

        case M68kException::DIVIDE_BY_ZERO:
        case M68kException::CHK:
        case M68kException::TRAPV:

            // Write stack frame
            C == Core::C68020 ?
            writeStackFrame0010<C>(status, reg.pc, reg.pc0, vector) :
            writeStackFrame0000<C>(status, reg.pc, vector);

            // Branch to exception handler
            jumpToVector<C,AE_SET_RW|AE_SET_IF>(vector);
            break;

        case M68kException::PRIVILEGE:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            SYNC(4);

            // Write stack frame
            writeStackFrame0000<C>(status, reg.pc - 2, vector);

            // Branch to exception handler
            jumpToVector<C,AE_SET_CB3>(vector);
            break;

        case M68kException::TRACE:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            // Recover from stop state
            flags &= ~State::STOPPED;

            SYNC(4);

            // Write stack frame
            writeStackFrame0000<C>(status, reg.pc, vector);

            // Branch to exception handler
            jumpToVector<C>(vector);
            break;

        case M68kException::FORMAT_ERROR:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            // Write stack frame
            if (MOIRA_MIMIC_MUSASHI) {
                writeStackFrame0000<C>(status, reg.pc, vector);
            } else {
                writeStackFrame0000<C>(status, reg.pc - 2, vector);
            }

            // Branch to exception handler
            jumpToVector<C, AE_SET_CB3>(vector);
            break;

        case M68kException::TRAP:

            // Write stack frame
            writeStackFrame0000<C>(status, reg.pc, u16(vector));

            // Branch to exception handler
            jumpToVector<C>(vector);
            break;

        default:
            break;
    }

    // Inform the delegate
    didExecute(exc, vector);
}